

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::pushType(PrintC *this,Datatype *ct)

{
  allocator local_61;
  string local_60;
  Atom local_40;
  
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,ct,1);
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  local_40.type = blanktoken;
  local_40.highlight = no_color;
  local_40.name = &local_60;
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,ct);
  return;
}

Assistant:

void PrintC::pushType(const Datatype *ct)

{
  pushTypeStart(ct,true);				// Print type (as if for a cast)
  pushAtom(Atom("",blanktoken,EmitXml::no_color));
  pushTypeEnd(ct);
}